

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O3

bool FixBuildPalette(BYTE *opal,int lump,bool blood)

{
  int iVar1;
  byte *pbVar2;
  ulong uVar4;
  byte bVar5;
  FMemLump data;
  FMemLump local_30;
  FMemLump FVar3;
  
  iVar1 = FWadCollection::LumpLength(&Wads,lump);
  if (0x2ff < iVar1) {
    FWadCollection::ReadLump((FWadCollection *)&stack0xffffffffffffffd0,0x1c70340);
    FVar3.Block.Chars = (FString)(FString)(FResourceFile **)0x0;
    if (*(int *)((long)local_30.Block.Chars + -0xc) != 0) {
      FVar3.Block.Chars = local_30.Block.Chars;
    }
    pbVar2 = (byte *)((long)FVar3.Block.Chars + 0x2ff);
    uVar4 = 0xfffffffffffffffd;
    do {
      bVar5 = pbVar2[-2];
      if (blood) {
        opal[uVar4 + 3] = bVar5;
        opal[uVar4 + 4] = pbVar2[-1];
        bVar5 = *pbVar2;
      }
      else {
        opal[uVar4 + 3] = bVar5 >> 4 | bVar5 * '\x04';
        opal[uVar4 + 4] = pbVar2[-1] >> 4 | pbVar2[-1] * '\x04';
        bVar5 = *pbVar2 >> 4 | *pbVar2 * '\x04';
      }
      opal[uVar4 + 5] = bVar5;
      uVar4 = uVar4 + 3;
      pbVar2 = pbVar2 + -3;
    } while (uVar4 < 0x2fd);
    FMemLump::~FMemLump(&stack0xffffffffffffffd0);
  }
  return 0x2ff < iVar1;
}

Assistant:

static bool FixBuildPalette (BYTE *opal, int lump, bool blood)
{
	if (Wads.LumpLength (lump) < 768)
	{
		return false;
	}

	FMemLump data = Wads.ReadLump (lump);
	const BYTE *ipal = (const BYTE *)data.GetMem();
	
	// Reverse the palette because BUILD used entry 255 as
	// transparent, but we use 0 as transparent.

	for (int c = 0; c < 768; c += 3)
	{
		if (!blood)
		{
			opal[c] =	(ipal[765-c] << 2) | (ipal[765-c] >> 4);
			opal[c+1] = (ipal[766-c] << 2) | (ipal[766-c] >> 4);
			opal[c+2] = (ipal[767-c] << 2) | (ipal[767-c] >> 4);
		}
		else
		{
			opal[c] = ipal[765-c];
			opal[c+1] = ipal[766-c];
			opal[c+2] = ipal[767-c];
		}
	}
	return true;
}